

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphBase.h
# Opt level: O3

Graph * GraphBase::load_graph
                  (Graph *__return_storage_ptr__,string *graphName,bool isReverse,string *probDist,
                  float probEdge)

{
  pointer pcVar1;
  pointer pvVar2;
  pointer ppVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs;
  time_t tVar9;
  pointer pvVar10;
  pointer ppVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  Graph *__range3;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *nbrs_4;
  pointer pvVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  int iVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vecInDeg;
  allocator_type local_79;
  pointer local_78;
  Graph *local_70;
  string local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_78 = (pointer)CONCAT44(local_78._4_4_,probEdge);
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (graphName->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + graphName->_M_string_length);
  IOcontroller::load_graph_struct(&local_68,__return_storage_ptr__,isReverse);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  iVar8 = tolower((int)*(probDist->_M_dataplus)._M_p);
  auVar7 = _DAT_00132150;
  auVar6 = _DAT_001320b0;
  auVar5 = _DAT_001320a0;
  if (iVar8 == 0x74) {
    dsfmt_chk_init_gen_rand(&dsfmt_global_data,0,0x4de1);
    pvVar15 = (__return_storage_ptr__->
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_78 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = __return_storage_ptr__;
    if (pvVar15 != local_78) {
      do {
        ppVar3 = (pvVar15->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        iVar8 = dsfmt_global_data.idx;
        for (ppVar11 = (pvVar15->
                       super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar3;
            ppVar11 = ppVar11 + 1) {
          if (0x17d < iVar8) {
            dsfmt_gen_rand_all(&dsfmt_global_data);
            iVar8 = 0;
          }
          lVar12 = (long)iVar8;
          iVar8 = iVar8 + 1;
          dsfmt_global_data.idx = iVar8;
          ppVar11->second =
               *(float *)(&DAT_001333fc +
                         (ulong)(*(uint *)((long)dsfmt_global_data.status + lVar12 * 8) % 3) * 4);
        }
        pvVar15 = pvVar15 + 1;
      } while (pvVar15 != local_78);
    }
    tVar9 = time((time_t *)0x0);
    dsfmt_chk_init_gen_rand(&dsfmt_global_data,(uint32_t)tVar9,0x4de1);
    __return_storage_ptr__ = local_70;
  }
  else if (iVar8 == 0x75) {
    pvVar15 = (__return_storage_ptr__->
              super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (; pvVar15 != pvVar2; pvVar15 = pvVar15 + 1) {
      ppVar11 = (pvVar15->
                super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppVar3 = (pvVar15->
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar11 != ppVar3) {
        uVar13 = (long)ppVar3 + (-8 - (long)ppVar11);
        auVar25._8_4_ = (int)uVar13;
        auVar25._0_8_ = uVar13;
        auVar25._12_4_ = (int)(uVar13 >> 0x20);
        auVar16._0_8_ = uVar13 >> 3;
        auVar16._8_8_ = auVar25._8_8_ >> 3;
        uVar14 = 0;
        do {
          auVar18._8_4_ = (int)uVar14;
          auVar18._0_8_ = uVar14;
          auVar18._12_4_ = (int)(uVar14 >> 0x20);
          auVar25 = (auVar18 | auVar5) ^ auVar6;
          iVar8 = SUB164(auVar16 ^ auVar6,0);
          bVar4 = iVar8 < auVar25._0_4_;
          iVar17 = SUB164(auVar16 ^ auVar6,4);
          iVar19 = auVar25._4_4_;
          if ((bool)(~(iVar17 < iVar19 || iVar19 == iVar17 && bVar4) & 1)) {
            ppVar11[uVar14].second = local_78._0_4_;
          }
          if (iVar17 >= iVar19 && (iVar19 != iVar17 || !bVar4)) {
            ppVar11[uVar14 + 1].second = local_78._0_4_;
          }
          auVar25 = (auVar18 | auVar7) ^ auVar6;
          iVar19 = auVar25._4_4_;
          if (iVar19 <= iVar17 && (iVar19 != iVar17 || auVar25._0_4_ <= iVar8)) {
            ppVar11[uVar14 + 2].second = local_78._0_4_;
            ppVar11[uVar14 + 3].second = local_78._0_4_;
          }
          uVar14 = uVar14 + 4;
        } while (((uVar13 >> 3) + 4 & 0x3ffffffffffffffc) != uVar14);
      }
    }
  }
  else if (iVar8 == 0x77) {
    if (isReverse) {
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar15 = (__return_storage_ptr__->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; pvVar15 != pvVar2;
          pvVar15 = pvVar15 + 1) {
        ppVar11 = (pvVar15->
                  super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar3 = (pvVar15->
                 super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (ppVar11 != ppVar3) {
          lVar12 = (long)ppVar3 - (long)ppVar11;
          auVar21._8_4_ = (int)(lVar12 >> 0x23);
          auVar21._0_8_ = lVar12 >> 3;
          auVar21._12_4_ = 0x45300000;
          fVar20 = (float)(1.0 / ((auVar21._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)(lVar12 >> 3)) -
                                 4503599627370496.0)));
          uVar13 = lVar12 - 8;
          auVar22._8_4_ = (int)uVar13;
          auVar22._0_8_ = uVar13;
          auVar22._12_4_ = (int)(uVar13 >> 0x20);
          auVar23._0_8_ = uVar13 >> 3;
          auVar23._8_8_ = auVar22._8_8_ >> 3;
          auVar23 = auVar23 ^ auVar6;
          uVar14 = 0;
          do {
            auVar24._8_4_ = (int)uVar14;
            auVar24._0_8_ = uVar14;
            auVar24._12_4_ = (int)(uVar14 >> 0x20);
            auVar25 = (auVar24 | auVar5) ^ auVar6;
            iVar8 = auVar23._4_4_;
            if ((bool)(~(iVar8 < auVar25._4_4_ ||
                        auVar23._0_4_ < auVar25._0_4_ && auVar25._4_4_ == iVar8) & 1)) {
              ppVar11[uVar14].second = fVar20;
            }
            if (auVar25._12_4_ <= auVar23._12_4_ &&
                (auVar25._8_4_ <= auVar23._8_4_ || auVar25._12_4_ != auVar23._12_4_)) {
              ppVar11[uVar14 + 1].second = fVar20;
            }
            auVar25 = (auVar24 | auVar7) ^ auVar6;
            iVar17 = auVar25._4_4_;
            if (iVar17 <= iVar8 && (iVar17 != iVar8 || auVar25._0_4_ <= auVar23._0_4_)) {
              ppVar11[uVar14 + 2].second = fVar20;
              ppVar11[uVar14 + 3].second = fVar20;
            }
            uVar14 = uVar14 + 4;
          } while (((uVar13 >> 3) + 4 & 0x3ffffffffffffffc) != uVar14);
        }
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_48,
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
                 &local_79);
      pvVar15 = (__return_storage_ptr__->
                super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar2 = (__return_storage_ptr__->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pvVar10 = pvVar15;
      if (pvVar15 != pvVar2) {
        do {
          ppVar3 = (pvVar10->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar11 = (pvVar10->
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar3;
              ppVar11 = ppVar11 + 1) {
            local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[ppVar11->first] =
                 local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[ppVar11->first] + 1;
          }
          pvVar10 = pvVar10 + 1;
        } while (pvVar10 != pvVar2);
        for (; pvVar15 != pvVar2; pvVar15 = pvVar15 + 1) {
          ppVar3 = (pvVar15->
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          for (ppVar11 = (pvVar15->
                         super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                         )._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar3;
              ppVar11 = ppVar11 + 1) {
            ppVar11->second =
                 1.0 / (float)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[ppVar11->first];
          }
        }
      }
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Graph load_graph(const std::string graphName, const bool isReverse, const std::string probDist = "load",
                            const float probEdge = float(0.1))
    {
        Graph graph;
        TIO::load_graph_struct(graphName, graph, isReverse);

        // Default is to load the edge including the diffusion probability from the file.
        // The following changes the setting of diffusion probability.
        if (tolower(probDist[0]) == 'w')
        {
            // Weighted cascade
            if (isReverse)
            {
                // Reverse graph
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = float(1.0 / nbrs.size());
                    }
                }
            }
            else
            {
                // Forward graph
                std::vector<uint32_t> vecInDeg(graph.size());
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        vecInDeg[nbr.first]++;
                    }
                }
                for (auto& nbrs : graph)
                {
                    for (auto& nbr : nbrs)
                    {
                        nbr.second = (float)1.0 / vecInDeg[nbr.first];
                    }
                }
            }

        }
        else if (tolower(probDist[0]) == 't')
        {
            // Trivalency cascade
            dsfmt_gv_init_gen_rand(0);
            float pProb[3] = {float(0.001), float(0.01), float(0.1)};
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = pProb[dsfmt_gv_genrand_uint32_range(3)];
                }
            }
            dsfmt_gv_init_gen_rand(static_cast<uint32_t>(time(nullptr)));
        }
        else if (tolower(probDist[0]) == 'u')
        {
            // Uniform probability
            for (auto& nbrs : graph)
            {
                for (auto& nbr : nbrs)
                {
                    nbr.second = probEdge;
                }
            }
        }
        return graph;
    }